

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# C1540.cpp
# Opt level: O1

void __thiscall Commodore::C1540::MachineBase::process_input_bit(MachineBase *this,int value)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  
  uVar2 = this->shift_register_ * 2 | value;
  this->shift_register_ = uVar2;
  bVar1 = (this->drive_VIA_port_handler_).port_b_;
  if ((~uVar2 & 0x3ff) == 0) {
    (this->drive_VIA_port_handler_).port_b_ = bVar1 & 0x7f;
    this->bit_window_offset_ = -1;
  }
  else {
    (this->drive_VIA_port_handler_).port_b_ = bVar1 | 0x80;
  }
  iVar3 = this->bit_window_offset_ + 1;
  this->bit_window_offset_ = iVar3;
  if (iVar3 == 8) {
    (this->drive_VIA_port_handler_).port_a_ = (uint8_t)uVar2;
    this->bit_window_offset_ = 0;
    if ((this->drive_VIA_port_handler_).should_set_overflow_ == true) {
      if ((this->m6502_).super_ProcessorBase.super_ProcessorStorage.set_overflow_line_is_enabled_ ==
          false) {
        (this->m6502_).super_ProcessorBase.super_ProcessorStorage.flags_.overflow = '@';
      }
      (this->m6502_).super_ProcessorBase.super_ProcessorStorage.set_overflow_line_is_enabled_ = true
      ;
      return;
    }
  }
  else {
    (this->m6502_).super_ProcessorBase.super_ProcessorStorage.set_overflow_line_is_enabled_ = false;
  }
  return;
}

Assistant:

void MachineBase::process_input_bit(int value) {
	shift_register_ = (shift_register_ << 1) | value;
	if((shift_register_ & 0x3ff) == 0x3ff) {
		drive_VIA_port_handler_.set_sync_detected(true);
		bit_window_offset_ = -1; // i.e. this bit isn't the first within a data window, but the next might be
	} else {
		drive_VIA_port_handler_.set_sync_detected(false);
	}
	bit_window_offset_++;
	if(bit_window_offset_ == 8) {
		drive_VIA_port_handler_.set_data_input(uint8_t(shift_register_));
		bit_window_offset_ = 0;
		if(drive_VIA_port_handler_.get_should_set_overflow()) {
			m6502_.set_overflow_line(true);
		}
	}
	else m6502_.set_overflow_line(false);
}